

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeRecordSet.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::AttributeRecordSet::operator==(AttributeRecordSet *this,AttributeRecordSet *Value)

{
  KBOOL KVar1;
  bool bVar2;
  AttributeRecordSet *Value_local;
  AttributeRecordSet *this_local;
  
  KVar1 = EntityIdentifier::operator!=(&this->m_EntityID,&Value->m_EntityID);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if (this->m_ui16NumAttrRecs == Value->m_ui16NumAttrRecs) {
    bVar2 = std::operator!=(&this->m_vAttrRec,&Value->m_vAttrRec);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL AttributeRecordSet::operator == ( const AttributeRecordSet & Value ) const
{
    if( m_EntityID        != Value.m_EntityID )        return false;
    if( m_ui16NumAttrRecs != Value.m_ui16NumAttrRecs ) return false;
    if( m_vAttrRec        != Value.m_vAttrRec )		   return false;
    return true;
}